

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderStart(Fts3Table *p,Fts3MultiSegReader *pCsr,char *zTerm,int nTerm)

{
  uint nSegment;
  Fts3SegReader *pReader;
  int iVar1;
  ulong uVar2;
  ulong extraout_RDX;
  long lVar3;
  
  nSegment = pCsr->nSegment;
  if (pCsr->bRestart == 0) {
    lVar3 = 0;
    do {
      uVar2 = (ulong)nSegment;
      if (pCsr->nSegment <= lVar3) break;
      pReader = pCsr->apSegment[lVar3];
      do {
        iVar1 = fts3SegReaderNext(p,pReader,(int)uVar2);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (zTerm == (char *)0x0) goto LAB_001c24ad;
        iVar1 = fts3SegReaderTermCmp(pReader,zTerm,nTerm);
        uVar2 = extraout_RDX;
      } while (iVar1 < 0);
      if ((iVar1 != 0) && (pReader->bLookup != '\0')) {
        fts3SegReaderSetEof(pReader);
      }
LAB_001c24ad:
      lVar3 = lVar3 + 1;
    } while (pCsr->bRestart == 0);
  }
  fts3SegReaderSort(pCsr->apSegment,nSegment,nSegment,fts3SegReaderCmp);
  return 0;
}

Assistant:

static int fts3SegReaderStart(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pCsr,       /* Cursor object */
  const char *zTerm,              /* Term searched for (or NULL) */
  int nTerm                       /* Length of zTerm in bytes */
){
  int i;
  int nSeg = pCsr->nSegment;

  /* If the Fts3SegFilter defines a specific term (or term prefix) to search
  ** for, then advance each segment iterator until it points to a term of
  ** equal or greater value than the specified term. This prevents many
  ** unnecessary merge/sort operations for the case where single segment
  ** b-tree leaf nodes contain more than one term.
  */
  for(i=0; pCsr->bRestart==0 && i<pCsr->nSegment; i++){
    int res = 0;
    Fts3SegReader *pSeg = pCsr->apSegment[i];
    do {
      int rc = fts3SegReaderNext(p, pSeg, 0);
      if( rc!=SQLITE_OK ) return rc;
    }while( zTerm && (res = fts3SegReaderTermCmp(pSeg, zTerm, nTerm))<0 );

    if( pSeg->bLookup && res!=0 ){
      fts3SegReaderSetEof(pSeg);
    }
  }
  fts3SegReaderSort(pCsr->apSegment, nSeg, nSeg, fts3SegReaderCmp);

  return SQLITE_OK;
}